

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void assemble_text(ifstream *in,ofstream *out,bool run)

{
  undefined8 this;
  type avm;
  File f;
  _Head_base<0UL,_vm::VM_*,_false> local_c0;
  undefined1 local_b8 [168];
  
  File::parse_file_text((File *)(local_b8 + 8),in);
  File::output_binary((File *)(local_b8 + 8),out);
  if (run) {
    File::File((File *)(local_b8 + 0x58),(File *)(local_b8 + 8));
    vm::VM::make_vm((VM *)local_b8,(File *)(local_b8 + 0x58));
    this = local_b8._0_8_;
    local_c0._M_head_impl = (VM *)local_b8._0_8_;
    local_b8._0_8_ = (__uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>)0x0;
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_b8);
    File::~File((File *)(local_b8 + 0x58));
    vm::VM::start((VM *)this);
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)&local_c0);
  }
  File::~File((File *)(local_b8 + 8));
  return;
}

Assistant:

void assemble_text(std::ifstream* in, std::ofstream* out, bool run = false) {
    try {
        File f = File::parse_file_text(*in);
        // f.output_text(std::cout);
        f.output_binary(*out);
        if (run) {
            auto avm = std::move(vm::VM::make_vm(f));
            avm->start();
        }
    }
    catch (const std::exception& e) {
        println(std::cerr, e.what());
    }
}